

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cpp
# Opt level: O1

SurfaceInteraction * __thiscall
pbrt::Transform::ApplyInverse
          (SurfaceInteraction *__return_storage_ptr__,Transform *this,SurfaceInteraction *si)

{
  Float FVar1;
  float fVar2;
  Float FVar3;
  Float FVar4;
  float fVar5;
  Float FVar6;
  Float FVar7;
  float fVar8;
  Float FVar9;
  Float FVar10;
  float fVar11;
  Float FVar12;
  ulong uVar13;
  undefined8 uVar14;
  bool bVar15;
  uintptr_t uVar16;
  Float FVar17;
  undefined1 uVar18;
  undefined1 uVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined4 uVar24;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  float fVar25;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [64];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  float fVar50;
  float fVar51;
  undefined1 auVar52 [16];
  float fVar53;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 in_ZMM19 [64];
  undefined1 extraout_var [60];
  
  auVar55 = in_ZMM19._0_16_;
  *(undefined8 *)&(__return_storage_ptr__->shading).dndv.super_Tuple3<pbrt::Normal3,_float>.z = 0;
  (__return_storage_ptr__->material).
  super_TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
  .bits = 0;
  (__return_storage_ptr__->areaLight).
  super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
  .bits = 0;
  (__return_storage_ptr__->dpdx).super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
  (__return_storage_ptr__->dpdx).super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
  *(undefined8 *)&(__return_storage_ptr__->dpdx).super_Tuple3<pbrt::Vector3,_float>.z = 0;
  (__return_storage_ptr__->dpdy).super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
  (__return_storage_ptr__->dpdy).super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
  __return_storage_ptr__->dudx = 0.0;
  __return_storage_ptr__->dvdx = 0.0;
  __return_storage_ptr__->dudy = 0.0;
  __return_storage_ptr__->dvdy = 0.0;
  (__return_storage_ptr__->shading).n.super_Tuple3<pbrt::Normal3,_float>.x = 0.0;
  (__return_storage_ptr__->shading).n.super_Tuple3<pbrt::Normal3,_float>.y = 0.0;
  *(undefined8 *)&(__return_storage_ptr__->shading).n.super_Tuple3<pbrt::Normal3,_float>.z = 0;
  (__return_storage_ptr__->shading).dpdu.super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
  (__return_storage_ptr__->shading).dpdu.super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
  (__return_storage_ptr__->shading).dpdv.super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
  (__return_storage_ptr__->shading).dpdv.super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
  *(undefined8 *)&(__return_storage_ptr__->shading).dpdv.super_Tuple3<pbrt::Vector3,_float>.z = 0;
  (__return_storage_ptr__->shading).dndu.super_Tuple3<pbrt::Normal3,_float>.y = 0.0;
  (__return_storage_ptr__->shading).dndu.super_Tuple3<pbrt::Normal3,_float>.z = 0.0;
  (__return_storage_ptr__->shading).dndv.super_Tuple3<pbrt::Normal3,_float>.x = 0.0;
  (__return_storage_ptr__->shading).dndv.super_Tuple3<pbrt::Normal3,_float>.y = 0.0;
  *(undefined8 *)&(__return_storage_ptr__->shading).dndv.super_Tuple3<pbrt::Normal3,_float>.z = 0;
  (__return_storage_ptr__->super_Interaction).mediumInterface = (MediumInterface *)0x0;
  (__return_storage_ptr__->super_Interaction).medium.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = 0;
  (__return_storage_ptr__->dpdu).super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
  (__return_storage_ptr__->dpdu).super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
  *(undefined8 *)&(__return_storage_ptr__->dpdu).super_Tuple3<pbrt::Vector3,_float>.z = 0;
  (__return_storage_ptr__->dpdv).super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
  (__return_storage_ptr__->dpdv).super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
  (__return_storage_ptr__->dndu).super_Tuple3<pbrt::Normal3,_float>.x = 0.0;
  (__return_storage_ptr__->dndu).super_Tuple3<pbrt::Normal3,_float>.y = 0.0;
  *(undefined8 *)&(__return_storage_ptr__->dndu).super_Tuple3<pbrt::Normal3,_float>.z = 0;
  (__return_storage_ptr__->dndv).super_Tuple3<pbrt::Normal3,_float>.y = 0.0;
  (__return_storage_ptr__->dndv).super_Tuple3<pbrt::Normal3,_float>.z = 0.0;
  operator()((Point3fi *)__return_storage_ptr__,this,(Point3fi *)si);
  (__return_storage_ptr__->super_Interaction).time = 0.0;
  (__return_storage_ptr__->super_Interaction).wo.super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
  (__return_storage_ptr__->super_Interaction).wo.super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
  (__return_storage_ptr__->super_Interaction).wo.super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
  (__return_storage_ptr__->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.x = 0.0;
  (__return_storage_ptr__->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.y = 0.0;
  *(undefined8 *)&(__return_storage_ptr__->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.z
       = 0;
  (__return_storage_ptr__->super_Interaction).uv.super_Tuple2<pbrt::Point2,_float>.y = 0.0;
  FVar1 = (this->mInv).m[0][0];
  fVar2 = (this->mInv).m[0][1];
  FVar3 = (this->mInv).m[0][2];
  FVar4 = (this->mInv).m[1][0];
  fVar5 = (this->mInv).m[1][1];
  FVar6 = (this->mInv).m[1][2];
  FVar7 = (this->mInv).m[2][0];
  fVar8 = (this->mInv).m[2][1];
  FVar9 = (this->mInv).m[2][2];
  FVar10 = (this->m).m[0][2];
  fVar11 = (this->m).m[1][2];
  FVar12 = (this->m).m[2][2];
  fVar25 = (si->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.y;
  auVar20._4_4_ = fVar25;
  auVar20._0_4_ = fVar25;
  auVar20._8_4_ = fVar25;
  auVar20._12_4_ = fVar25;
  fVar50 = (si->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.x;
  auVar23._4_4_ = fVar50;
  auVar23._0_4_ = fVar50;
  auVar23._8_4_ = fVar50;
  auVar23._12_4_ = fVar50;
  fVar50 = (si->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.z;
  auVar42._4_4_ = fVar50;
  auVar42._0_4_ = fVar50;
  auVar42._8_4_ = fVar50;
  auVar42._12_4_ = fVar50;
  auVar20 = vmulss_avx512f(ZEXT416((uint)fVar11),auVar20);
  auVar21 = vfmadd231ss_avx512f(auVar20,ZEXT416((uint)FVar10),auVar23);
  auVar52._8_8_ = 0;
  auVar52._0_8_ = *(ulong *)(this->m).m[0];
  uVar13 = *(ulong *)(this->m).m[1];
  auVar45._8_8_ = 0;
  auVar45._0_8_ = *(ulong *)(this->m).m[2];
  auVar54._0_4_ = (float)uVar13 * fVar25;
  auVar54._4_4_ = (float)(uVar13 >> 0x20) * fVar25;
  auVar54._8_4_ = fVar25 * 0.0;
  auVar54._12_4_ = fVar25 * 0.0;
  auVar20 = vfmadd231ps_fma(auVar54,auVar52,auVar23);
  auVar23 = vfmadd231ps_fma(auVar20,auVar45,auVar42);
  auVar22._0_4_ = auVar23._0_4_ * auVar23._0_4_;
  auVar22._4_4_ = auVar23._4_4_ * auVar23._4_4_;
  auVar22._8_4_ = auVar23._8_4_ * auVar23._8_4_;
  auVar22._12_4_ = auVar23._12_4_ * auVar23._12_4_;
  auVar20 = vhaddps_avx(auVar22,auVar22);
  auVar21 = vfmadd231ss_avx512f(auVar21,ZEXT416((uint)FVar12),auVar42);
  auVar22 = vmulss_avx512f(auVar21,auVar21);
  fVar25 = auVar22._0_4_ + auVar20._0_4_;
  if (fVar25 < 0.0) {
    auVar32._0_4_ = sqrtf(fVar25);
    auVar32._4_60_ = extraout_var;
    auVar20 = auVar32._0_16_;
    auVar21 = ZEXT416(auVar21._0_4_);
  }
  else {
    auVar20 = vsqrtss_avx(ZEXT416((uint)fVar25),ZEXT416((uint)fVar25));
  }
  uVar24 = auVar20._0_4_;
  auVar33._4_4_ = uVar24;
  auVar33._0_4_ = uVar24;
  auVar33._8_4_ = uVar24;
  auVar33._12_4_ = uVar24;
  auVar23 = vdivps_avx(auVar23,auVar33);
  auVar20 = vdivss_avx512f(auVar21,auVar20);
  uVar14 = vmovlps_avx(auVar23);
  (__return_storage_ptr__->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.x =
       (float)(int)uVar14;
  (__return_storage_ptr__->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.y =
       (float)(int)((ulong)uVar14 >> 0x20);
  (__return_storage_ptr__->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.z = auVar20._0_4_
  ;
  fVar25 = (si->super_Interaction).wo.super_Tuple3<pbrt::Vector3,_float>.x;
  fVar50 = (si->super_Interaction).wo.super_Tuple3<pbrt::Vector3,_float>.y;
  fVar51 = (si->super_Interaction).wo.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar20 = vfmadd231ss_fma(ZEXT416((uint)(fVar2 * fVar50)),ZEXT416((uint)FVar1),
                            ZEXT416((uint)fVar25));
  auVar20 = vfmadd231ss_fma(auVar20,ZEXT416((uint)FVar3),ZEXT416((uint)fVar51));
  auVar23 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * fVar50)),ZEXT416((uint)FVar4),
                            ZEXT416((uint)fVar25));
  auVar23 = vfmadd231ss_fma(auVar23,ZEXT416((uint)FVar6),ZEXT416((uint)fVar51));
  auVar21 = vfmadd231ss_fma(ZEXT416((uint)(fVar8 * fVar50)),ZEXT416((uint)FVar7),
                            ZEXT416((uint)fVar25));
  auVar21 = vfmadd231ss_fma(auVar21,ZEXT416((uint)FVar9),ZEXT416((uint)fVar51));
  fVar50 = auVar20._0_4_;
  fVar51 = auVar23._0_4_;
  fVar53 = auVar21._0_4_;
  fVar25 = fVar53 * fVar53 + fVar50 * fVar50 + fVar51 * fVar51;
  uVar19 = fVar25 == 0.0;
  uVar18 = fVar25 < 0.0;
  if ((bool)uVar18) {
    fVar25 = sqrtf(fVar25);
    auVar23 = ZEXT416((uint)fVar51);
    auVar20 = ZEXT416((uint)fVar50);
  }
  else {
    auVar21 = vsqrtss_avx(ZEXT416((uint)fVar25),ZEXT416((uint)fVar25));
    fVar25 = auVar21._0_4_;
  }
  auVar34._0_4_ = auVar20._0_4_ / fVar25;
  auVar34._4_12_ = auVar20._4_12_;
  auVar43._0_4_ = auVar23._0_4_ / fVar25;
  auVar43._4_12_ = auVar23._4_12_;
  auVar20 = vinsertps_avx(auVar34,auVar43,0x10);
  uVar14 = vmovlps_avx(auVar20);
  (__return_storage_ptr__->super_Interaction).wo.super_Tuple3<pbrt::Vector3,_float>.x =
       (float)(int)uVar14;
  (__return_storage_ptr__->super_Interaction).wo.super_Tuple3<pbrt::Vector3,_float>.y =
       (float)(int)((ulong)uVar14 >> 0x20);
  (__return_storage_ptr__->super_Interaction).wo.super_Tuple3<pbrt::Vector3,_float>.z =
       fVar53 / fVar25;
  (__return_storage_ptr__->super_Interaction).time = (si->super_Interaction).time;
  (__return_storage_ptr__->super_Interaction).mediumInterface =
       (si->super_Interaction).mediumInterface;
  (__return_storage_ptr__->super_Interaction).uv.super_Tuple2<pbrt::Point2,_float> =
       (si->super_Interaction).uv.super_Tuple2<pbrt::Point2,_float>;
  fVar25 = (si->dpdu).super_Tuple3<pbrt::Vector3,_float>.x;
  fVar50 = (si->dpdu).super_Tuple3<pbrt::Vector3,_float>.y;
  fVar51 = (si->dpdu).super_Tuple3<pbrt::Vector3,_float>.z;
  auVar20 = vfmadd231ss_fma(ZEXT416((uint)(fVar2 * fVar50)),ZEXT416((uint)FVar1),
                            ZEXT416((uint)fVar25));
  auVar20 = vfmadd231ss_fma(auVar20,ZEXT416((uint)FVar3),ZEXT416((uint)fVar51));
  auVar23 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * fVar50)),ZEXT416((uint)FVar4),
                            ZEXT416((uint)fVar25));
  auVar23 = vfmadd231ss_fma(auVar23,ZEXT416((uint)FVar6),ZEXT416((uint)fVar51));
  auVar20 = vinsertps_avx(auVar20,auVar23,0x10);
  auVar23 = vfmadd231ss_fma(ZEXT416((uint)(fVar8 * fVar50)),ZEXT416((uint)FVar7),
                            ZEXT416((uint)fVar25));
  auVar23 = vfmadd231ss_fma(auVar23,ZEXT416((uint)FVar9),ZEXT416((uint)fVar51));
  uVar14 = vmovlps_avx(auVar20);
  (__return_storage_ptr__->dpdu).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar14;
  (__return_storage_ptr__->dpdu).super_Tuple3<pbrt::Vector3,_float>.y =
       (float)(int)((ulong)uVar14 >> 0x20);
  (__return_storage_ptr__->dpdu).super_Tuple3<pbrt::Vector3,_float>.z = auVar23._0_4_;
  fVar25 = (si->dpdv).super_Tuple3<pbrt::Vector3,_float>.x;
  fVar50 = (si->dpdv).super_Tuple3<pbrt::Vector3,_float>.y;
  fVar51 = (si->dpdv).super_Tuple3<pbrt::Vector3,_float>.z;
  auVar20 = vfmadd231ss_fma(ZEXT416((uint)(fVar2 * fVar50)),ZEXT416((uint)FVar1),
                            ZEXT416((uint)fVar25));
  auVar20 = vfmadd231ss_fma(auVar20,ZEXT416((uint)FVar3),ZEXT416((uint)fVar51));
  auVar23 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * fVar50)),ZEXT416((uint)FVar4),
                            ZEXT416((uint)fVar25));
  auVar23 = vfmadd231ss_fma(auVar23,ZEXT416((uint)FVar6),ZEXT416((uint)fVar51));
  auVar20 = vinsertps_avx(auVar20,auVar23,0x10);
  auVar23 = vfmadd231ss_fma(ZEXT416((uint)(fVar8 * fVar50)),ZEXT416((uint)FVar7),
                            ZEXT416((uint)fVar25));
  auVar23 = vfmadd231ss_fma(auVar23,ZEXT416((uint)FVar9),ZEXT416((uint)fVar51));
  uVar14 = vmovlps_avx(auVar20);
  (__return_storage_ptr__->dpdv).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar14;
  (__return_storage_ptr__->dpdv).super_Tuple3<pbrt::Vector3,_float>.y =
       (float)(int)((ulong)uVar14 >> 0x20);
  (__return_storage_ptr__->dpdv).super_Tuple3<pbrt::Vector3,_float>.z = auVar23._0_4_;
  fVar25 = (si->dndu).super_Tuple3<pbrt::Normal3,_float>.y;
  auVar26._4_4_ = fVar25;
  auVar26._0_4_ = fVar25;
  auVar26._8_4_ = fVar25;
  auVar26._12_4_ = fVar25;
  fVar50 = (si->dndu).super_Tuple3<pbrt::Normal3,_float>.x;
  auVar35._4_4_ = fVar50;
  auVar35._0_4_ = fVar50;
  auVar35._8_4_ = fVar50;
  auVar35._12_4_ = fVar50;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = uVar13;
  auVar20 = vmulps_avx512vl(auVar21,auVar26);
  auVar20 = vfmadd231ps_avx512vl(auVar20,auVar52,auVar35);
  fVar50 = (si->dndu).super_Tuple3<pbrt::Normal3,_float>.z;
  auVar46._4_4_ = fVar50;
  auVar46._0_4_ = fVar50;
  auVar46._8_4_ = fVar50;
  auVar46._12_4_ = fVar50;
  auVar23 = vfmadd231ps_avx512vl(auVar20,auVar45,auVar46);
  auVar20 = vfmadd231ss_fma(ZEXT416((uint)(fVar11 * fVar25)),ZEXT416((uint)FVar10),auVar35);
  auVar20 = vfmadd231ss_fma(auVar20,ZEXT416((uint)FVar12),auVar46);
  uVar14 = vmovlps_avx(auVar23);
  (__return_storage_ptr__->dndu).super_Tuple3<pbrt::Normal3,_float>.x = (float)(int)uVar14;
  (__return_storage_ptr__->dndu).super_Tuple3<pbrt::Normal3,_float>.y =
       (float)(int)((ulong)uVar14 >> 0x20);
  (__return_storage_ptr__->dndu).super_Tuple3<pbrt::Normal3,_float>.z = auVar20._0_4_;
  fVar25 = (si->dndv).super_Tuple3<pbrt::Normal3,_float>.y;
  auVar27._4_4_ = fVar25;
  auVar27._0_4_ = fVar25;
  auVar27._8_4_ = fVar25;
  auVar27._12_4_ = fVar25;
  fVar50 = (si->dndv).super_Tuple3<pbrt::Normal3,_float>.x;
  auVar36._4_4_ = fVar50;
  auVar36._0_4_ = fVar50;
  auVar36._8_4_ = fVar50;
  auVar36._12_4_ = fVar50;
  auVar20 = vmulps_avx512vl(auVar21,auVar27);
  auVar20 = vfmadd231ps_avx512vl(auVar20,auVar52,auVar36);
  fVar50 = (si->dndv).super_Tuple3<pbrt::Normal3,_float>.z;
  auVar47._4_4_ = fVar50;
  auVar47._0_4_ = fVar50;
  auVar47._8_4_ = fVar50;
  auVar47._12_4_ = fVar50;
  auVar23 = vfmadd231ps_avx512vl(auVar20,auVar45,auVar47);
  auVar20 = vfmadd231ss_fma(ZEXT416((uint)(fVar11 * fVar25)),ZEXT416((uint)FVar10),auVar36);
  auVar20 = vfmadd231ss_fma(auVar20,ZEXT416((uint)FVar12),auVar47);
  uVar14 = vmovlps_avx(auVar23);
  (__return_storage_ptr__->dndv).super_Tuple3<pbrt::Normal3,_float>.x = (float)(int)uVar14;
  (__return_storage_ptr__->dndv).super_Tuple3<pbrt::Normal3,_float>.y =
       (float)(int)((ulong)uVar14 >> 0x20);
  (__return_storage_ptr__->dndv).super_Tuple3<pbrt::Normal3,_float>.z = auVar20._0_4_;
  fVar25 = (si->shading).n.super_Tuple3<pbrt::Normal3,_float>.y;
  auVar28._4_4_ = fVar25;
  auVar28._0_4_ = fVar25;
  auVar28._8_4_ = fVar25;
  auVar28._12_4_ = fVar25;
  fVar50 = (si->shading).n.super_Tuple3<pbrt::Normal3,_float>.x;
  auVar37._4_4_ = fVar50;
  auVar37._0_4_ = fVar50;
  auVar37._8_4_ = fVar50;
  auVar37._12_4_ = fVar50;
  auVar20 = vfmadd231ss_fma(ZEXT416((uint)(fVar11 * fVar25)),ZEXT416((uint)FVar10),auVar37);
  fVar25 = (si->shading).n.super_Tuple3<pbrt::Normal3,_float>.z;
  auVar44._4_4_ = fVar25;
  auVar44._0_4_ = fVar25;
  auVar44._8_4_ = fVar25;
  auVar44._12_4_ = fVar25;
  auVar23 = vmulps_avx512vl(auVar21,auVar28);
  auVar23 = vfmadd231ps_avx512vl(auVar23,auVar52,auVar37);
  auVar21 = vfmadd231ps_avx512vl(auVar23,auVar45,auVar44);
  auVar29._0_4_ = auVar21._0_4_ * auVar21._0_4_;
  auVar29._4_4_ = auVar21._4_4_ * auVar21._4_4_;
  auVar29._8_4_ = auVar21._8_4_ * auVar21._8_4_;
  auVar29._12_4_ = auVar21._12_4_ * auVar21._12_4_;
  vhaddps_avx(auVar29,auVar29);
  auVar23 = vfmadd231ss_fma(auVar20,ZEXT416((uint)FVar12),auVar44);
  auVar22 = vxorps_avx512vl(auVar55,auVar55);
  auVar20 = vucomiss_avx512f(auVar22);
  if ((bool)uVar18) {
    fVar25 = sqrtf(auVar20._0_4_);
    vxorps_avx512vl(auVar22,auVar22);
  }
  else {
    auVar20 = vsqrtss_avx(auVar20,auVar20);
    fVar25 = auVar20._0_4_;
  }
  auVar38._4_4_ = fVar25;
  auVar38._0_4_ = fVar25;
  auVar38._8_4_ = fVar25;
  auVar38._12_4_ = fVar25;
  auVar20 = vdivps_avx(auVar21,auVar38);
  uVar14 = vmovlps_avx(auVar20);
  (__return_storage_ptr__->shading).n.super_Tuple3<pbrt::Normal3,_float>.x = (float)(int)uVar14;
  (__return_storage_ptr__->shading).n.super_Tuple3<pbrt::Normal3,_float>.y =
       (float)(int)((ulong)uVar14 >> 0x20);
  (__return_storage_ptr__->shading).n.super_Tuple3<pbrt::Normal3,_float>.z = auVar23._0_4_ / fVar25;
  fVar25 = (si->shading).dpdu.super_Tuple3<pbrt::Vector3,_float>.x;
  fVar50 = (si->shading).dpdu.super_Tuple3<pbrt::Vector3,_float>.y;
  fVar51 = (si->shading).dpdu.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar20 = vfmadd231ss_fma(ZEXT416((uint)(fVar2 * fVar50)),ZEXT416((uint)FVar1),
                            ZEXT416((uint)fVar25));
  auVar20 = vfmadd231ss_fma(auVar20,ZEXT416((uint)FVar3),ZEXT416((uint)fVar51));
  auVar23 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * fVar50)),ZEXT416((uint)FVar4),
                            ZEXT416((uint)fVar25));
  auVar23 = vfmadd231ss_fma(auVar23,ZEXT416((uint)FVar6),ZEXT416((uint)fVar51));
  auVar20 = vinsertps_avx(auVar20,auVar23,0x10);
  auVar23 = vfmadd231ss_fma(ZEXT416((uint)(fVar8 * fVar50)),ZEXT416((uint)FVar7),
                            ZEXT416((uint)fVar25));
  auVar23 = vfmadd231ss_fma(auVar23,ZEXT416((uint)FVar9),ZEXT416((uint)fVar51));
  uVar14 = vmovlps_avx(auVar20);
  (__return_storage_ptr__->shading).dpdu.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar14;
  (__return_storage_ptr__->shading).dpdu.super_Tuple3<pbrt::Vector3,_float>.y =
       (float)(int)((ulong)uVar14 >> 0x20);
  (__return_storage_ptr__->shading).dpdu.super_Tuple3<pbrt::Vector3,_float>.z = auVar23._0_4_;
  fVar25 = (si->shading).dpdv.super_Tuple3<pbrt::Vector3,_float>.x;
  fVar50 = (si->shading).dpdv.super_Tuple3<pbrt::Vector3,_float>.y;
  fVar51 = (si->shading).dpdv.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar20 = vfmadd231ss_fma(ZEXT416((uint)(fVar2 * fVar50)),ZEXT416((uint)FVar1),
                            ZEXT416((uint)fVar25));
  auVar20 = vfmadd231ss_fma(auVar20,ZEXT416((uint)FVar3),ZEXT416((uint)fVar51));
  auVar23 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * fVar50)),ZEXT416((uint)FVar4),
                            ZEXT416((uint)fVar25));
  auVar23 = vfmadd231ss_fma(auVar23,ZEXT416((uint)FVar6),ZEXT416((uint)fVar51));
  auVar20 = vinsertps_avx(auVar20,auVar23,0x10);
  auVar23 = vfmadd231ss_fma(ZEXT416((uint)(fVar8 * fVar50)),ZEXT416((uint)FVar7),
                            ZEXT416((uint)fVar25));
  auVar23 = vfmadd231ss_fma(auVar23,ZEXT416((uint)FVar9),ZEXT416((uint)fVar51));
  uVar14 = vmovlps_avx(auVar20);
  (__return_storage_ptr__->shading).dpdv.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar14;
  (__return_storage_ptr__->shading).dpdv.super_Tuple3<pbrt::Vector3,_float>.y =
       (float)(int)((ulong)uVar14 >> 0x20);
  (__return_storage_ptr__->shading).dpdv.super_Tuple3<pbrt::Vector3,_float>.z = auVar23._0_4_;
  fVar25 = (si->shading).dndu.super_Tuple3<pbrt::Normal3,_float>.y;
  auVar30._4_4_ = fVar25;
  auVar30._0_4_ = fVar25;
  auVar30._8_4_ = fVar25;
  auVar30._12_4_ = fVar25;
  fVar50 = (si->shading).dndu.super_Tuple3<pbrt::Normal3,_float>.x;
  auVar39._4_4_ = fVar50;
  auVar39._0_4_ = fVar50;
  auVar39._8_4_ = fVar50;
  auVar39._12_4_ = fVar50;
  auVar55._8_8_ = 0;
  auVar55._0_8_ = uVar13;
  auVar20 = vmulps_avx512vl(auVar55,auVar30);
  auVar20 = vfmadd231ps_avx512vl(auVar20,auVar52,auVar39);
  fVar50 = (si->shading).dndu.super_Tuple3<pbrt::Normal3,_float>.z;
  auVar48._4_4_ = fVar50;
  auVar48._0_4_ = fVar50;
  auVar48._8_4_ = fVar50;
  auVar48._12_4_ = fVar50;
  auVar23 = vfmadd231ps_avx512vl(auVar20,auVar45,auVar48);
  auVar20 = vfmadd231ss_fma(ZEXT416((uint)(fVar11 * fVar25)),ZEXT416((uint)FVar10),auVar39);
  auVar20 = vfmadd231ss_fma(auVar20,ZEXT416((uint)FVar12),auVar48);
  uVar14 = vmovlps_avx(auVar23);
  (__return_storage_ptr__->shading).dndu.super_Tuple3<pbrt::Normal3,_float>.x = (float)(int)uVar14;
  (__return_storage_ptr__->shading).dndu.super_Tuple3<pbrt::Normal3,_float>.y =
       (float)(int)((ulong)uVar14 >> 0x20);
  (__return_storage_ptr__->shading).dndu.super_Tuple3<pbrt::Normal3,_float>.z = auVar20._0_4_;
  fVar25 = (si->shading).dndv.super_Tuple3<pbrt::Normal3,_float>.y;
  auVar31._4_4_ = fVar25;
  auVar31._0_4_ = fVar25;
  auVar31._8_4_ = fVar25;
  auVar31._12_4_ = fVar25;
  fVar50 = (si->shading).dndv.super_Tuple3<pbrt::Normal3,_float>.x;
  auVar40._4_4_ = fVar50;
  auVar40._0_4_ = fVar50;
  auVar40._8_4_ = fVar50;
  auVar40._12_4_ = fVar50;
  auVar20 = vmulps_avx512vl(auVar55,auVar31);
  auVar20 = vfmadd231ps_avx512vl(auVar20,auVar40,auVar52);
  fVar50 = (si->shading).dndv.super_Tuple3<pbrt::Normal3,_float>.z;
  auVar49._4_4_ = fVar50;
  auVar49._0_4_ = fVar50;
  auVar49._8_4_ = fVar50;
  auVar49._12_4_ = fVar50;
  auVar23 = vfmadd231ps_avx512vl(auVar20,auVar49,auVar45);
  auVar20 = vfmadd231ss_fma(ZEXT416((uint)(fVar11 * fVar25)),ZEXT416((uint)FVar10),auVar40);
  auVar20 = vfmadd231ss_fma(auVar20,ZEXT416((uint)FVar12),auVar49);
  uVar14 = vmovlps_avx(auVar23);
  (__return_storage_ptr__->shading).dndv.super_Tuple3<pbrt::Normal3,_float>.x = (float)(int)uVar14;
  (__return_storage_ptr__->shading).dndv.super_Tuple3<pbrt::Normal3,_float>.y =
       (float)(int)((ulong)uVar14 >> 0x20);
  (__return_storage_ptr__->shading).dndv.super_Tuple3<pbrt::Normal3,_float>.z = auVar20._0_4_;
  FVar10 = si->dvdx;
  FVar12 = si->dudy;
  FVar17 = si->dvdy;
  __return_storage_ptr__->dudx = si->dudx;
  __return_storage_ptr__->dvdx = FVar10;
  __return_storage_ptr__->dudy = FVar12;
  __return_storage_ptr__->dvdy = FVar17;
  fVar11 = (si->dpdx).super_Tuple3<pbrt::Vector3,_float>.x;
  fVar25 = (si->dpdx).super_Tuple3<pbrt::Vector3,_float>.y;
  fVar50 = (si->dpdx).super_Tuple3<pbrt::Vector3,_float>.z;
  auVar20 = vfmadd231ss_fma(ZEXT416((uint)(fVar2 * fVar25)),ZEXT416((uint)FVar1),
                            ZEXT416((uint)fVar11));
  auVar20 = vfmadd231ss_fma(auVar20,ZEXT416((uint)FVar3),ZEXT416((uint)fVar50));
  auVar23 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * fVar25)),ZEXT416((uint)FVar4),
                            ZEXT416((uint)fVar11));
  auVar23 = vfmadd231ss_fma(auVar23,ZEXT416((uint)FVar6),ZEXT416((uint)fVar50));
  auVar20 = vinsertps_avx(auVar20,auVar23,0x10);
  auVar23 = vfmadd231ss_fma(ZEXT416((uint)(fVar8 * fVar25)),ZEXT416((uint)FVar7),
                            ZEXT416((uint)fVar11));
  auVar23 = vfmadd231ss_fma(auVar23,ZEXT416((uint)FVar9),ZEXT416((uint)fVar50));
  uVar14 = vmovlps_avx(auVar20);
  (__return_storage_ptr__->dpdx).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar14;
  (__return_storage_ptr__->dpdx).super_Tuple3<pbrt::Vector3,_float>.y =
       (float)(int)((ulong)uVar14 >> 0x20);
  (__return_storage_ptr__->dpdx).super_Tuple3<pbrt::Vector3,_float>.z = auVar23._0_4_;
  fVar11 = (si->dpdy).super_Tuple3<pbrt::Vector3,_float>.x;
  fVar25 = (si->dpdy).super_Tuple3<pbrt::Vector3,_float>.y;
  fVar50 = (si->dpdy).super_Tuple3<pbrt::Vector3,_float>.z;
  auVar20 = vfmadd231ss_fma(ZEXT416((uint)(fVar2 * fVar25)),ZEXT416((uint)fVar11),
                            ZEXT416((uint)FVar1));
  auVar20 = vfmadd231ss_fma(auVar20,ZEXT416((uint)fVar50),ZEXT416((uint)FVar3));
  auVar23 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * fVar25)),ZEXT416((uint)fVar11),
                            ZEXT416((uint)FVar4));
  auVar23 = vfmadd231ss_fma(auVar23,ZEXT416((uint)fVar50),ZEXT416((uint)FVar6));
  auVar20 = vinsertps_avx(auVar20,auVar23,0x10);
  auVar23 = vfmadd231ss_fma(ZEXT416((uint)(fVar8 * fVar25)),ZEXT416((uint)FVar7),
                            ZEXT416((uint)fVar11));
  auVar23 = vfmadd231ss_fma(auVar23,ZEXT416((uint)FVar9),ZEXT416((uint)fVar50));
  uVar14 = vmovlps_avx(auVar20);
  (__return_storage_ptr__->dpdy).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar14;
  (__return_storage_ptr__->dpdy).super_Tuple3<pbrt::Vector3,_float>.y =
       (float)(int)((ulong)uVar14 >> 0x20);
  (__return_storage_ptr__->dpdy).super_Tuple3<pbrt::Vector3,_float>.z = auVar23._0_4_;
  uVar16 = (si->areaLight).
           super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
           .bits;
  (__return_storage_ptr__->material).
  super_TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
  .bits = (si->material).
          super_TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
          .bits;
  (__return_storage_ptr__->areaLight).
  super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
  .bits = uVar16;
  uVar13._0_4_ = (__return_storage_ptr__->shading).n.super_Tuple3<pbrt::Normal3,_float>.x;
  uVar13._4_4_ = (__return_storage_ptr__->shading).n.super_Tuple3<pbrt::Normal3,_float>.y;
  auVar41._8_8_ = 0;
  auVar41._0_8_ = uVar13;
  fVar2 = (__return_storage_ptr__->shading).n.super_Tuple3<pbrt::Normal3,_float>.z;
  fVar5 = (__return_storage_ptr__->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.z;
  auVar20 = vmovshdup_avx(auVar41);
  auVar23 = ZEXT416((uint)(fVar2 * fVar5));
  auVar20 = vfmadd132ss_fma(auVar20,auVar23,
                            ZEXT416((uint)(__return_storage_ptr__->super_Interaction).n.
                                          super_Tuple3<pbrt::Normal3,_float>.y));
  auVar23 = vfmsub213ss_fma(ZEXT416((uint)fVar5),ZEXT416((uint)fVar2),auVar23);
  auVar23 = vfmadd132ss_fma(auVar41,ZEXT416((uint)(auVar20._0_4_ + auVar23._0_4_)),
                            ZEXT416((uint)(__return_storage_ptr__->super_Interaction).n.
                                          super_Tuple3<pbrt::Normal3,_float>.x));
  auVar20 = vucomiss_avx512f(auVar23);
  if (!(bool)uVar18 && !(bool)uVar19) {
    auVar41._0_8_ = uVar13 ^ 0x8000000080000000;
    auVar41._8_4_ = 0x80000000;
    auVar41._12_4_ = 0x80000000;
  }
  uVar14 = vcmpss_avx512f(auVar23,auVar20,1);
  bVar15 = (bool)((byte)uVar14 & 1);
  uVar14 = vmovlps_avx(auVar41);
  (__return_storage_ptr__->shading).n.super_Tuple3<pbrt::Normal3,_float>.x = (float)(int)uVar14;
  (__return_storage_ptr__->shading).n.super_Tuple3<pbrt::Normal3,_float>.y =
       (float)(int)((ulong)uVar14 >> 0x20);
  (__return_storage_ptr__->shading).n.super_Tuple3<pbrt::Normal3,_float>.z =
       (float)((uint)bVar15 * (int)-fVar2 + (uint)!bVar15 * (int)fVar2);
  __return_storage_ptr__->faceIndex = si->faceIndex;
  return __return_storage_ptr__;
}

Assistant:

SurfaceInteraction Transform::ApplyInverse(const SurfaceInteraction &si) const {
    SurfaceInteraction ret;
    ret.pi = (*this)(si.pi);

    // Transform remaining members of _SurfaceInteraction_
    Transform t = Inverse(*this);
    ret.n = Normalize(t(si.n));
    ret.wo = Normalize(t(si.wo));
    ret.time = si.time;
    ret.mediumInterface = si.mediumInterface;
    ret.uv = si.uv;
    ret.dpdu = t(si.dpdu);
    ret.dpdv = t(si.dpdv);
    ret.dndu = t(si.dndu);
    ret.dndv = t(si.dndv);
    ret.shading.n = Normalize(t(si.shading.n));
    ret.shading.dpdu = t(si.shading.dpdu);
    ret.shading.dpdv = t(si.shading.dpdv);
    ret.shading.dndu = t(si.shading.dndu);
    ret.shading.dndv = t(si.shading.dndv);
    ret.dudx = si.dudx;
    ret.dvdx = si.dvdx;
    ret.dudy = si.dudy;
    ret.dvdy = si.dvdy;
    ret.dpdx = t(si.dpdx);
    ret.dpdy = t(si.dpdy);
    ret.material = si.material;
    ret.areaLight = si.areaLight;
    //    ret.n = FaceForward(ret.n, ret.shading.n);
    ret.shading.n = FaceForward(ret.shading.n, ret.n);
    ret.faceIndex = si.faceIndex;
    return ret;
}